

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall cali::Caliper::end_with_value_check(Caliper *this,Attribute *attr,Variant *data)

{
  bool bVar1;
  uint prop_00;
  uint uVar2;
  cali_id_t attr_id;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *this_00;
  element_type *peVar3;
  Variant VVar4;
  bool local_15a;
  lock_guard<std::mutex> local_150;
  lock_guard<std::mutex> gbb_1;
  ChannelBody *local_138;
  Caliper *local_130;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_128;
  Channel *channel;
  iterator __end2;
  iterator __begin2;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range2;
  cali_variant_t local_100;
  undefined4 local_ec;
  BlackboardEntry local_e8;
  lock_guard<std::mutex> local_b8;
  lock_guard<std::mutex> gbb;
  BlackboardEntry local_a0;
  lock_guard<(anonymous_namespace)::siglock> local_70;
  lock_guard<(anonymous_namespace)::siglock> g;
  BlackboardEntry current;
  cali_id_t key;
  bool run_events;
  int scope;
  int prop;
  Variant *data_local;
  Attribute *attr_local;
  Caliper *this_local;
  
  if ((this->sT->stack_error & 1U) != 0) {
    return;
  }
  prop_00 = Attribute::properties(attr);
  uVar2 = prop_00 & 0x3c;
  attr_id = Attribute::id(attr);
  current.entry.m_value.m_v.value.v_uint =
       anon_unknown.dwarf_30b7b8::get_blackboard_key(attr_id,prop_00);
  Entry::Entry((Entry *)&g);
  Entry::Entry((Entry *)&current.merged_entry.m_value.m_v.value);
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard(&local_70,&this->sT->lock);
  if (uVar2 == 0x14) {
    anon_unknown.dwarf_30b7b8::load_current_entry
              (&local_a0,attr,current.entry.m_value.m_v.value.v_uint,&this->sT->thread_blackboard);
    memcpy(&g,&local_a0,0x30);
  }
  else {
    if (uVar2 != 0xc) {
      local_ec = 1;
      goto LAB_003f0b25;
    }
    std::lock_guard<std::mutex>::lock_guard(&local_b8,&this->sG->process_blackboard_lock);
    anon_unknown.dwarf_30b7b8::load_current_entry
              (&local_e8,attr,current.entry.m_value.m_v.value.v_uint,&this->sG->process_blackboard);
    memcpy(&g,&local_e8,0x30);
    std::lock_guard<std::mutex>::~lock_guard(&local_b8);
  }
  bVar1 = Entry::empty((Entry *)&current.merged_entry.m_value.m_v.value);
  local_15a = true;
  if (!bVar1) {
    local_100 = (cali_variant_t)Entry::value((Entry *)&current.merged_entry.m_value.m_v.value);
    local_15a = cali::operator!=(data,(Variant *)&local_100);
  }
  if (local_15a == false) {
    if ((prop_00 & 0x40) == 0) {
      this_00 = &this->sG->active_channels;
      __end2 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(this_00);
      channel = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                    *)&channel);
        if (!bVar1) break;
        local_128 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                       ::operator*(&__end2);
        peVar3 = std::
                 __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_128);
        local_130 = this;
        local_138 = Channel::body((Channel *)local_128);
        VVar4 = Entry::value((Entry *)&current.merged_entry.m_value.m_v.value);
        gbb_1._M_device = (mutex_type *)VVar4.m_v.type_and_size;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(peVar3->events).pre_end_evt,&local_130,&local_138,attr,(Variant *)&gbb_1);
        __gnu_cxx::
        __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
        ::operator++(&__end2);
      }
    }
    if (uVar2 == 0x14) {
      anon_unknown.dwarf_30b7b8::handle_end
                (attr,prop_00,(BlackboardEntry *)&g,current.entry.m_value.m_v.value.v_uint,
                 &this->sT->thread_blackboard,&this->sT->tree);
    }
    else {
      std::lock_guard<std::mutex>::lock_guard(&local_150,&this->sG->process_blackboard_lock);
      anon_unknown.dwarf_30b7b8::handle_end
                (attr,prop_00,(BlackboardEntry *)&g,current.entry.m_value.m_v.value.v_uint,
                 &this->sG->process_blackboard,&this->sT->tree);
      std::lock_guard<std::mutex>::~lock_guard(&local_150);
    }
    local_ec = 0;
  }
  else {
    anon_unknown.dwarf_30b7b8::log_stack_value_error
              ((Entry *)&current.merged_entry.m_value.m_v.value,(Attribute)attr->m_node,data);
    this->sT->stack_error = true;
    local_ec = 1;
  }
LAB_003f0b25:
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard(&local_70);
  return;
}

Assistant:

void Caliper::end_with_value_check(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t key = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty() || data != current.entry.value()) {
        log_stack_value_error(current.entry, attr, data);
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}